

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# div.cc
# Opt level: O0

int BN_mod_pow2(BIGNUM *r,BIGNUM *a,size_t e)

{
  int iVar1;
  ulong uVar2;
  ulong words;
  BIGNUM *pBVar3;
  size_t top_word_exponent;
  size_t num_words;
  size_t e_local;
  BIGNUM *a_local;
  BIGNUM *r_local;
  
  if ((e == 0) || (a->width == 0)) {
    BN_zero(r);
    r_local._4_4_ = 1;
  }
  else {
    uVar2 = e - 1 >> 6;
    words = uVar2 + 1;
    if ((ulong)(long)a->width < words) {
      pBVar3 = BN_copy((BIGNUM *)r,(BIGNUM *)a);
      r_local._4_4_ = (uint)(pBVar3 != (BIGNUM *)0x0);
    }
    else {
      iVar1 = bn_wexpand(r,words);
      if (iVar1 == 0) {
        r_local._4_4_ = 0;
      }
      else {
        OPENSSL_memcpy(r->d,a->d,words * 8);
        if ((e & 0x3f) != 0) {
          r->d[uVar2] = (1L << (sbyte)(e & 0x3f)) - 1U & r->d[uVar2];
        }
        r->neg = a->neg;
        r->width = (int)words;
        bn_set_minimal_width(r);
        r_local._4_4_ = 1;
      }
    }
  }
  return r_local._4_4_;
}

Assistant:

int BN_mod_pow2(BIGNUM *r, const BIGNUM *a, size_t e) {
  if (e == 0 || a->width == 0) {
    BN_zero(r);
    return 1;
  }

  size_t num_words = 1 + ((e - 1) / BN_BITS2);

  // If |a| definitely has less than |e| bits, just BN_copy.
  if ((size_t)a->width < num_words) {
    return BN_copy(r, a) != NULL;
  }

  // Otherwise, first make sure we have enough space in |r|.
  // Note that this will fail if num_words > INT_MAX.
  if (!bn_wexpand(r, num_words)) {
    return 0;
  }

  // Copy the content of |a| into |r|.
  OPENSSL_memcpy(r->d, a->d, num_words * sizeof(BN_ULONG));

  // If |e| isn't word-aligned, we have to mask off some of our bits.
  size_t top_word_exponent = e % (sizeof(BN_ULONG) * 8);
  if (top_word_exponent != 0) {
    r->d[num_words - 1] &= (((BN_ULONG)1) << top_word_exponent) - 1;
  }

  // Fill in the remaining fields of |r|.
  r->neg = a->neg;
  r->width = (int)num_words;
  bn_set_minimal_width(r);
  return 1;
}